

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall PhPacker_Arg_I_Test::TestBody(PhPacker_Arg_I_Test *this)

{
  uint uVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertHelper local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar_1;
  uint32_t expected;
  uint32_t result;
  string str;
  uint32_t res;
  string s;
  
  PhPacker::pack<unsigned_int,_0>(&s,'I',0x7b);
  PhPacker::unpack((PhPacker *)&str,'I',&s);
  uVar1 = std::any_cast<unsigned_int>((any *)&str);
  std::any::reset((any *)&str);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  res = uVar1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&str,"res","123",&res,(int *)&gtest_ar_1);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (str._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&str._M_string_length);
  PhPacker::pack<unsigned_int,_0>(&str,'I',0x270fddc2);
  PhPacker::unpack((PhPacker *)&gtest_ar_1,'I',&str);
  uVar1 = std::any_cast<unsigned_int>((any *)&gtest_ar_1);
  std::any::reset((any *)&gtest_ar_1);
  expected = 0x270fddc2;
  result = uVar1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"result","expected",&result,&expected);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    PhPacker::pack<unsigned_int,_0>((string *)&gtest_ar_1,'I',0xffffffff);
    std::__cxx11::string::operator=((string *)&str,(string *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    PhPacker::unpack((PhPacker *)&gtest_ar_1,'I',&str);
    result = std::any_cast<unsigned_int>((any *)&gtest_ar_1);
    std::any::reset((any *)&gtest_ar_1);
    expected = 0xffffffff;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar_1,"result","expected",&result,&expected);
    if (gtest_ar_1.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      PhPacker::pack<unsigned_int,_0>((string *)&gtest_ar_1,'I',0);
      std::__cxx11::string::operator=((string *)&str,(string *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      PhPacker::unpack((PhPacker *)&gtest_ar_1,'I',&str);
      result = std::any_cast<unsigned_int>((any *)&gtest_ar_1);
      std::any::reset((any *)&gtest_ar_1);
      expected = 0;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar_1,"result","expected",&result,&expected);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_98);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0x85,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_98.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
      }
      goto LAB_0010d8d4;
    }
    testing::Message::Message((Message *)&local_98);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if (local_98.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_98.data_ + 8))();
  }
LAB_0010d8d4:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

TEST(PhPacker, Arg_I)
{
   auto s = PhPacker::pack('I', 123u);
   uint32_t res = std::any_cast<uint32_t>(PhPacker::unpack('I', s));
   EXPECT_EQ(res, 123);

   std::string str = PhPacker::pack('I', 655351234u);
   uint32_t result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   uint32_t expected = 655351234u;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('I', std::numeric_limits<uint32_t>::max());
   result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   expected = std::numeric_limits<uint32_t>::max();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('I', std::numeric_limits<uint32_t>::min());
   result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   expected = std::numeric_limits<uint32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}